

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

void __thiscall
duckdb::Connection::
CreateAggregateFunction<duckdb::UDFCovarPopOperation,duckdb::udf_covar_state_t,double,double,double>
          (Connection *this,string *name)

{
  AggregateFunction *pAVar1;
  AggregateFunction *in_RDI;
  AggregateFunction function;
  string *in_stack_fffffffffffffd48;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_fffffffffffffd50;
  LogicalType local_298 [40];
  undefined1 local_270 [304];
  AggregateFunction local_140;
  
  pAVar1 = &local_140;
  UDFWrapper::
  CreateAggregateFunction<duckdb::UDFCovarPopOperation,duckdb::udf_covar_state_t,double,double,double>
            (in_stack_fffffffffffffd48);
  AggregateFunction::AggregateFunction(pAVar1,in_RDI);
  pAVar1 = (AggregateFunction *)
           shared_ptr<duckdb::ClientContext,_true>::operator*(in_stack_fffffffffffffd50);
  duckdb::LogicalType::LogicalType(local_298,INVALID);
  duckdb::UDFWrapper::RegisterAggrFunction(local_270,pAVar1,local_298);
  duckdb::LogicalType::~LogicalType(local_298);
  AggregateFunction::~AggregateFunction(pAVar1);
  AggregateFunction::~AggregateFunction(pAVar1);
  return;
}

Assistant:

void CreateAggregateFunction(const string &name) {
		AggregateFunction function = UDFWrapper::CreateAggregateFunction<UDF_OP, STATE, TR, TA, TB>(name);
		UDFWrapper::RegisterAggrFunction(function, *context);
	}